

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::StrCat<absl::Hex,char[4],std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d
          ,AlphaNum *e,Hex *args,char (*args_1) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  StringifySink local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  size_t local_88;
  char *pcStack_80;
  size_t local_78;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  string_view local_48;
  string_view local_38;
  size_type local_28;
  undefined8 local_20;
  
  local_98 = *(undefined8 *)this;
  uStack_90 = *(undefined8 *)(this + 8);
  local_88 = (a->piece_)._M_len;
  pcStack_80 = (a->piece_)._M_str;
  local_78 = (b->piece_)._M_len;
  pcStack_70 = (b->piece_)._M_str;
  local_68 = (c->piece_)._M_len;
  pcStack_60 = (c->piece_)._M_str;
  local_58 = (d->piece_)._M_len;
  pcStack_50 = (d->piece_)._M_str;
  local_b8.buffer_._M_dataplus._M_p = (pointer)&local_b8.buffer_.field_2;
  local_b8.buffer_.field_2._M_allocated_capacity = 0;
  local_b8.buffer_.field_2._8_8_ = 0;
  local_b8.buffer_._M_string_length = 0;
  local_48 = strings_internal::ExtractStringification<absl::Hex>(&local_b8,(Hex *)e);
  local_38 = NullSafeStringView((Nullable<const_char_*>)args);
  local_20 = *(undefined8 *)args_1;
  local_28 = *(size_type *)(args_1 + 2);
  pieces._M_len = local_28;
  pieces._M_array = (iterator)0x8;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_98,pieces);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}